

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O1

void placalc::LoadItemToAmplification(void)

{
  double dVar1;
  uint uVar2;
  FILE *pFVar3;
  size_t sVar4;
  mapped_type *pmVar5;
  size_t sVar6;
  iterator iVar7;
  FILE *unaff_RBX;
  int iVar8;
  char *this;
  placalc *this_00;
  int *unaff_R12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  item_amplification ia;
  int opts;
  undefined4 uStack_118;
  int iStack_114;
  float fStack_110;
  uint uStack_10c;
  undefined8 uStack_108;
  undefined8 uStack_100;
  int iStack_f8;
  int iStack_f4;
  key_type kStack_f0;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  FILE *pFStack_d0;
  int *piStack_c8;
  int iStack_90;
  int iStack_8c;
  key_type kStack_88;
  int iStack_80;
  float fStack_7c;
  double dStack_78;
  undefined1 auStack_6c [4];
  FILE *pFStack_68;
  int *piStack_60;
  int local_34;
  int local_30;
  undefined1 local_2c [4];
  
  pFVar3 = fopen("input/amplifications.bin","rb");
  if (pFVar3 == (FILE *)0x0) {
LAB_0010280e:
    LoadItemToAmplification();
    this = "static/lossfactors.bin";
    pFStack_68 = unaff_RBX;
    piStack_60 = unaff_R12;
    pFVar3 = fopen("static/lossfactors.bin","rb");
    if (pFVar3 != (FILE *)0x0) {
      sVar4 = fread(auStack_6c,4,1,pFVar3);
      if ((sVar4 != 0) && (sVar4 = fread(&iStack_90,8,1,pFVar3), sVar4 != 0)) {
        dStack_78 = (double)extraout_XMM0_Da;
        do {
          kStack_88.event_id = iStack_90;
          iVar8 = iStack_8c;
          if (iStack_8c != 0) {
            do {
              sVar4 = fread(&iStack_80,8,1,pFVar3);
              if (sVar4 == 0) {
                return;
              }
              kStack_88.amplification_id = iStack_80;
              dVar1 = ((double)fStack_7c + -1.0) * dStack_78;
              pmVar5 = std::__detail::
                       _Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)factors_,&kStack_88);
              *pmVar5 = (float)(dVar1 + 1.0);
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
            if (sVar4 == 0) {
              return;
            }
          }
          sVar4 = fread(&iStack_90,8,1,pFVar3);
        } while (sVar4 != 0);
      }
      return;
    }
    LoadPostLossAmplificationFactors();
    uStack_108 = in_XMM1_Qa;
    uStack_100 = in_XMM1_Qb;
    fStack_e8 = extraout_XMM0_Da_00;
    pFStack_d0 = unaff_RBX;
    piStack_c8 = unaff_R12;
    LoadItemToAmplification();
    if (((float)uStack_108 == 0.0) && (!NAN((float)uStack_108))) {
      LoadPostLossAmplificationFactors((placalc *)this,fStack_e8);
    }
    uStack_10c = 0;
    fread(&uStack_10c,4,1,_stdin);
    this_00 = (placalc *)(ulong)uStack_10c;
    uVar2 = 0x1000000;
    if ((uStack_10c >> 0x18 & 1) == 0) {
      uVar2 = uStack_10c & 0x2000000;
    }
    if ((uVar2 != 0x1000000) && (uVar2 != 0x2000000)) {
      doit(this_00);
      if (*(void **)this_00 == (void *)0x0) {
        return;
      }
      operator_delete(*(void **)this_00);
      return;
    }
    fwrite(&uStack_10c,4,1,_stdout);
    uStack_118 = 0;
    sVar4 = fread(&uStack_118,4,1,_stdin);
    if (sVar4 == 0) {
      doit((placalc *)&uStack_118);
    }
    fwrite(&uStack_118,4,1,_stdout);
    fStack_e8 = (float)(~-(uint)((float)uStack_108 == 0.0) & (uint)(float)uStack_108 |
                       -(uint)((float)uStack_108 == 0.0) & 0x3f800000);
    uStack_e4 = uStack_108._4_4_;
    uStack_e0 = (undefined4)uStack_100;
    uStack_dc = uStack_100._4_4_;
    do {
      if (sVar4 == 0) {
        return;
      }
      sVar6 = fread(&iStack_f8,8,1,_stdin);
      if (sVar6 == 0) {
        sVar4 = 0;
      }
      else {
        fwrite(&iStack_f8,8,1,_stdout);
        kStack_f0.event_id = iStack_f8;
        kStack_f0.amplification_id = *(int *)(item_to_amplification_ + (long)iStack_f4 * 4);
        iVar7 = std::
                _Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)factors_,&kStack_f0);
        uStack_108 = CONCAT44(uStack_108._4_4_,fStack_e8);
        if (iVar7.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>.
            _M_cur != (__node_type *)0x0) {
          uStack_108 = CONCAT44(uStack_108._4_4_,
                                *(undefined4 *)
                                 ((long)iVar7.
                                        super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                        ._M_cur + 0x10));
        }
        do {
          sVar4 = fread(&iStack_114,8,1,_stdin);
          if (sVar4 == 0) break;
          fStack_110 = fStack_110 * (float)uStack_108;
          fwrite(&iStack_114,8,1,_stdout);
        } while (iStack_114 != 0);
      }
      if (sVar6 == 0) {
        return;
      }
    } while( true );
  }
  fread(local_2c,4,1,pFVar3);
  sVar4 = fread(&local_34,8,1,pFVar3);
  if (sVar4 != 0) {
    iVar8 = 1;
    unaff_R12 = &local_34;
    do {
      if (_DAT_001071a8 == _DAT_001071b0) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&item_to_amplification_,_DAT_001071a8,
                   &local_30);
      }
      else {
        *_DAT_001071a8 = local_30;
        _DAT_001071a8 = _DAT_001071a8 + 1;
      }
      if (iVar8 != local_34) {
        LoadItemToAmplification();
        unaff_RBX = pFVar3;
        goto LAB_0010280e;
      }
      iVar8 = iVar8 + 1;
      sVar4 = fread(unaff_R12,8,1,pFVar3);
    } while (sVar4 != 0);
  }
  fclose(pFVar3);
  return;
}

Assistant:

void LoadItemToAmplification() {

    FILE * fin = fopen(AMPLIFICATION_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      AMPLIFICATION_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    item_amplification ia;
    int expectedItemID = 1;
    i = fread(&ia, sizeof(ia), 1, fin);
    while (i != 0) {
      item_to_amplification_.push_back(ia.amplification_id);
      if (ia.item_id != expectedItemID) {
	fprintf(stderr, "FATAL: %s: Item IDs are not contiguous. "
			"Expected item ID %d but read item ID %d\n",
		__func__, expectedItemID, ia.item_id);
	exit(EXIT_FAILURE);
      }
      ++expectedItemID;
      i = fread(&ia, sizeof(ia), 1, fin);
    }

    fclose(fin);

  }